

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

void __thiscall Args::HelpPrinter::~HelpPrinter(HelpPrinter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_HelpPrinterIface)._vptr_HelpPrinterIface = (_func_int **)&PTR__HelpPrinter_00118928;
  pcVar2 = (this->m_appDescription)._M_dataplus._M_p;
  paVar1 = &(this->m_appDescription).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_exeName)._M_dataplus._M_p;
  paVar1 = &(this->m_exeName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

inline
HelpPrinter::~HelpPrinter()
{
}